

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O0

art_val_t * art_iterator_erase(art_t *art,art_iterator_t *iterator)

{
  undefined1 uVar1;
  art_node_t *key;
  art_node_t *paVar2;
  art_node_t *new_child;
  art_iterator_t *in_RSI;
  undefined8 *in_RDI;
  art_key_chunk_t key_chunk_in_grandparent;
  art_inner_node_t *grandparent_node;
  art_node_t *new_parent_node;
  art_key_chunk_t key_chunk_in_parent;
  art_inner_node_t *parent_node;
  _Bool went_up;
  art_val_t *value_erased;
  art_key_chunk_t initial_key [6];
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  undefined8 in_stack_ffffffffffffffb0;
  art_key_chunk_t key_chunk;
  art_inner_node_t *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  art_key_chunk_t aVar3;
  undefined7 in_stack_ffffffffffffffd0;
  art_node_t *local_8;
  
  key_chunk = (art_key_chunk_t)((ulong)in_stack_ffffffffffffffb0 >> 0x38);
  if (in_RSI->value == (art_val_t *)0x0) {
    local_8 = (art_node_t *)0x0;
  }
  else {
    local_8 = (art_node_t *)in_RSI->value;
    uVar1 = art_iterator_up((art_iterator_t *)
                            CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
    if ((bool)uVar1) {
      key = art_iterator_node(in_RSI);
      aVar3 = in_RSI->key[(int)((uint)in_RSI->depth + (uint)(byte)key[1])];
      paVar2 = art_node_erase(in_stack_ffffffffffffffb8,key_chunk);
      if (paVar2 != key) {
        in_RSI->frames[in_RSI->frame].node = paVar2;
        uVar1 = art_iterator_up((art_iterator_t *)
                                CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
        if ((bool)uVar1) {
          new_child = art_iterator_node(in_RSI);
          art_replace((art_inner_node_t *)CONCAT17(aVar3,in_stack_ffffffffffffffc0),
                      (art_key_chunk_t)((ulong)paVar2 >> 0x38),new_child);
        }
        else {
          *in_RDI = paVar2;
        }
      }
      in_RSI->frame = '\0';
      in_RSI->depth = '\0';
      art_node_iterator_lower_bound
                (local_8,(art_iterator_t *)CONCAT17(uVar1,in_stack_ffffffffffffffd0),
                 (art_key_chunk_t *)key);
    }
    else {
      *in_RDI = 0;
      art_iterator_invalid_loc((art_iterator_t *)0x10e627);
    }
  }
  return (art_val_t *)local_8;
}

Assistant:

art_val_t *art_iterator_erase(art_t *art, art_iterator_t *iterator) {
    if (iterator->value == NULL) {
        return NULL;
    }
    art_key_chunk_t initial_key[ART_KEY_BYTES];
    memcpy(initial_key, iterator->key, ART_KEY_BYTES);

    art_val_t *value_erased = iterator->value;
    bool went_up = art_iterator_up(iterator);
    if (!went_up) {
        // We're erasing the root.
        art->root = NULL;
        art_iterator_invalid_loc(iterator);
        return value_erased;
    }

    // Erase the leaf.
    art_inner_node_t *parent_node =
        (art_inner_node_t *)art_iterator_node(iterator);
    art_key_chunk_t key_chunk_in_parent =
        iterator->key[iterator->depth + parent_node->prefix_size];
    art_node_t *new_parent_node =
        art_node_erase(parent_node, key_chunk_in_parent);

    if (new_parent_node != ((art_node_t *)parent_node)) {
        // Replace the pointer to the inner node we erased from in its
        // parent (it may be a leaf now).
        iterator->frames[iterator->frame].node = new_parent_node;
        went_up = art_iterator_up(iterator);
        if (went_up) {
            art_inner_node_t *grandparent_node =
                (art_inner_node_t *)art_iterator_node(iterator);
            art_key_chunk_t key_chunk_in_grandparent =
                iterator->key[iterator->depth + grandparent_node->prefix_size];
            art_replace(grandparent_node, key_chunk_in_grandparent,
                        new_parent_node);
        } else {
            // We were already at the rootmost node.
            art->root = new_parent_node;
        }
    }

    iterator->frame = 0;
    iterator->depth = 0;
    // Do a lower bound search for the initial key, which will find the first
    // greater key if it exists. This can likely be mildly faster if we instead
    // start from the current position.
    art_node_iterator_lower_bound(art->root, iterator, initial_key);
    return value_erased;
}